

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O2

void __thiscall r_exec::Group::inject_group(Group *this,View *view)

{
  Group *this_00;
  bool bVar1;
  uint32_t uVar2;
  mapped_type *this_01;
  mapped_type *pmVar3;
  _Mem *this_02;
  UpdateJob *this_03;
  uint64_t uVar4;
  float fVar5;
  float fVar6;
  Group *local_38;
  
  std::mutex::lock(&this->mutex);
  local_38 = (Group *)View::get_oid(view);
  this_01 = std::__detail::
            _Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->group_views,(key_type *)&local_38);
  core::P<r_exec::View>::operator=(this_01,view);
  fVar5 = get_c_sln(this);
  fVar6 = get_c_sln_thr(this);
  if (fVar6 < fVar5) {
    fVar5 = View::get_sln(view);
    fVar6 = get_sln_thr(this);
    if (fVar6 < fVar5) {
      fVar5 = View::get_vis(view);
      fVar6 = get_vis_thr(this);
      if (fVar6 < fVar5) {
        bVar1 = View::get_cov(view);
        local_38 = this;
        pmVar3 = std::__detail::
                 _Map_base<r_exec::Group_*,_std::pair<r_exec::Group_*const,_bool>,_std::allocator<std::pair<r_exec::Group_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<r_exec::Group_*>,_std::hash<r_exec::Group_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<r_exec::Group_*,_std::pair<r_exec::Group_*const,_bool>,_std::allocator<std::pair<r_exec::Group_*const,_bool>_>,_std::__detail::_Select1st,_std::equal_to<r_exec::Group_*>,_std::hash<r_exec::Group_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)((view->super_View).object.object + 0x3b),&local_38);
        *pmVar3 = bVar1;
      }
      inject_reduction_jobs(this,view);
    }
  }
  uVar2 = get_upr((Group *)(view->super_View).object.object);
  if (uVar2 != 0) {
    this_02 = (_Mem *)r_code::Mem::Get();
    this_03 = (UpdateJob *)operator_new(0x28);
    this_00 = (Group *)(view->super_View).object.object;
    uVar4 = (*Now)();
    uVar4 = get_next_upr_time(this_00,uVar4);
    UpdateJob::UpdateJob(this_03,this_00,uVar4);
    _Mem::pushTimeJob(this_02,(TimeJob *)this_03);
  }
  notifyNew(this,view);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  return;
}

Assistant:

void Group::inject_group(View *view)
{
    std::lock_guard<std::mutex> guard(mutex);
    group_views[view->get_oid()] = view;

    if (get_c_sln() > get_c_sln_thr() && view->get_sln() > get_sln_thr()) { // group is c-salient and view is salient.
        if (view->get_vis() > get_vis_thr()) { // new visible group in a c-active and c-salient host.
            ((Group *)view->object)->viewing_groups[this] = view->get_cov();
        }

        inject_reduction_jobs(view);
    }

    if (((Group *)view->object)->get_upr() > 0) { // inject the next update job for the group.
        _Mem::Get()->pushTimeJob(new UpdateJob((Group *)view->object, ((Group *)view->object)->get_next_upr_time(Now())));
    }

    notifyNew(view);
}